

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::SampleCountChannel::set(SampleCountChannel *this,int x,int y,uint newNumSamples)

{
  ImageLevel *pIVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  void *pvVar12;
  DeepImageLevel *newSampleListPositions;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  ImageChannel *in_RDI;
  size_t j;
  size_t *oldSampleListPositions;
  uint *oldNumSamples;
  int newSampleListSize;
  size_t i;
  size_t in_stack_fffffffffffffef8;
  SampleCountChannel *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  DeepImageLevel *in_stack_ffffffffffffff10;
  ulong local_50;
  
  pIVar1 = in_RDI[1]._level;
  iVar6 = ImageChannel::pixelsPerRow(in_RDI);
  uVar8 = (long)pIVar1 +
          (((long)in_ESI * 4 + (long)(in_EDX * iVar6) * 4) - (long)in_RDI[1]._vptr_ImageChannel) >>
          2;
  if (*(uint *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4) < in_ECX) {
    if (*(uint *)(*(long *)&in_RDI[1]._xSampling + uVar8 * 4) < in_ECX) {
      uVar7 = anon_unknown_6::roundListSizeUp(in_ECX);
      if (in_RDI[2]._vptr_ImageChannel < (_func_int **)(in_RDI[1]._numPixels + (long)(int)uVar7)) {
        *(ulong *)&in_RDI[1]._pixelsPerColumn =
             *(long *)&in_RDI[1]._pixelsPerColumn +
             (ulong)(in_ECX - *(int *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4));
        pp_Var2 = in_RDI[1]._vptr_ImageChannel;
        sVar9 = ImageChannel::numPixels(in_RDI);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = sVar9;
        uVar10 = SUB168(auVar4 * ZEXT816(4),0);
        if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pp_Var11 = (_func_int **)operator_new__(uVar10);
        in_RDI[1]._vptr_ImageChannel = pp_Var11;
        resetBasePointer(in_stack_ffffffffffffff00);
        pvVar3 = *(void **)&in_RDI[1]._pLinear;
        sVar9 = ImageChannel::numPixels(in_RDI);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = sVar9;
        uVar10 = SUB168(auVar5 * ZEXT816(8),0);
        if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pvVar12 = operator_new__(uVar10);
        *(void **)&in_RDI[1]._pLinear = pvVar12;
        in_RDI[1]._numPixels = 0;
        for (local_50 = 0; sVar9 = ImageChannel::numPixels(in_RDI), local_50 < sVar9;
            local_50 = local_50 + 1) {
          if (local_50 == uVar8) {
            *(uint *)((long)in_RDI[1]._vptr_ImageChannel + local_50 * 4) = in_ECX;
          }
          else {
            *(undefined4 *)((long)in_RDI[1]._vptr_ImageChannel + local_50 * 4) =
                 *(undefined4 *)((long)pp_Var2 + local_50 * 4);
          }
          *(size_t *)(*(long *)&in_RDI[1]._pLinear + local_50 * 8) = in_RDI[1]._numPixels;
          in_stack_ffffffffffffff0c =
               anon_unknown_6::roundListSizeUp
                         (*(uint *)((long)in_RDI[1]._vptr_ImageChannel + local_50 * 4));
          *(uint *)(*(long *)&in_RDI[1]._xSampling + local_50 * 4) = in_stack_ffffffffffffff0c;
          in_RDI[1]._numPixels =
               (ulong)*(uint *)(*(long *)&in_RDI[1]._xSampling + local_50 * 4) +
               in_RDI[1]._numPixels;
        }
        pp_Var11 = (_func_int **)anon_unknown_6::roundBufferSizeUp(in_RDI[1]._numPixels);
        in_RDI[2]._vptr_ImageChannel = pp_Var11;
        newSampleListPositions = deepLevel((SampleCountChannel *)0x138f51);
        DeepImageLevel::moveSamplesToNewBuffer
                  (in_stack_ffffffffffffff10,
                   (uint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (uint *)pp_Var11,(size_t *)newSampleListPositions);
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
      }
      else {
        deepLevel((SampleCountChannel *)0x138b7a);
        DeepImageLevel::moveSampleList
                  (in_stack_ffffffffffffff10,
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20),(uint)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8);
        *(size_t *)(*(long *)&in_RDI[1]._pLinear + uVar8 * 8) = in_RDI[1]._numPixels;
        in_RDI[1]._numPixels = (long)(int)uVar7 + in_RDI[1]._numPixels;
        *(ulong *)&in_RDI[1]._pixelsPerColumn =
             (ulong)(in_ECX - *(int *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4)) +
             *(long *)&in_RDI[1]._pixelsPerColumn;
        *(uint *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4) = in_ECX;
      }
    }
    else {
      deepLevel((SampleCountChannel *)0x138ac8);
      DeepImageLevel::setSamplesToZero
                (in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20),(uint)in_stack_ffffffffffffff00);
      *(ulong *)&in_RDI[1]._pixelsPerColumn =
           (ulong)(in_ECX - *(int *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4)) +
           *(long *)&in_RDI[1]._pixelsPerColumn;
      *(uint *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4) = in_ECX;
    }
  }
  else {
    *(ulong *)&in_RDI[1]._pixelsPerColumn =
         *(long *)&in_RDI[1]._pixelsPerColumn -
         (ulong)(*(int *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4) - in_ECX);
    *(uint *)((long)in_RDI[1]._vptr_ImageChannel + uVar8 * 4) = in_ECX;
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int x, int y, unsigned int newNumSamples)
{
    //
    // Set the number of samples for pixel (x,y) to newNumSamples.
    // Compute the position of the pixel in the the various
    // arrays that describe it.
    //

    size_t i = (_base + y * pixelsPerRow () + x) - _numSamples;

    if (newNumSamples <= _numSamples[i])
    {
        //
        // The number of samples for the pixel becomes smaller.
        // Save the new number of samples.
        //

        _totalNumSamples -= _numSamples[i] - newNumSamples;
        _numSamples[i] = newNumSamples;
        return;
    }

    if (newNumSamples <= _sampleListSizes[i])
    {
        //
        // The number of samples for the pixel becomes larger, but the new
        // number of samples still fits into the space that has been allocated
        // for the sample list.  Set the new samples at the end of the list to
        // zero.
        //

        deepLevel ().setSamplesToZero (i, _numSamples[i], newNumSamples);

        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    int newSampleListSize = roundListSizeUp (newNumSamples);

    if (_totalSamplesOccupied + newSampleListSize <= _sampleBufferSize)
    {
        //
        // The number of samples in the pixel no longer fits into the
        // space that has been allocated for the sample list, but there
        // is space available at the end of the sample buffer.  Allocate
        // space for a new list at the end of the sample buffer, and move
        // the sample list from its old location to its new, larger place.
        //

        deepLevel ().moveSampleList (
            i, _numSamples[i], newNumSamples, _totalSamplesOccupied);

        _sampleListPositions[i] = _totalSamplesOccupied;
        _totalSamplesOccupied += newSampleListSize;
        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    //
    // The new number of samples no longer fits into the space that has
    // been allocated for the sample list, and there is not enough room
    // at the end of the sample buffer for a new, larger sample list.
    // Allocate an entirely new sample buffer, and move all existing
    // sample lists into it.
    //

    unsigned int* oldNumSamples          = 0;
    size_t*       oldSampleListPositions = 0;

    try
    {
        _totalNumSamples += newNumSamples - _numSamples[i];

        oldNumSamples = _numSamples;
        _numSamples   = new unsigned int[numPixels ()];

        resetBasePointer ();

        oldSampleListPositions = _sampleListPositions;
        _sampleListPositions   = new size_t[numPixels ()];

        _totalSamplesOccupied = 0;

        for (size_t j = 0; j < numPixels (); ++j)
        {
            if (j == i)
                _numSamples[j] = newNumSamples;
            else
                _numSamples[j] = oldNumSamples[j];

            _sampleListPositions[j] = _totalSamplesOccupied;
            _sampleListSizes[j]     = roundListSizeUp (_numSamples[j]);
            _totalSamplesOccupied += _sampleListSizes[j];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel ().moveSamplesToNewBuffer (
            oldNumSamples, _numSamples, _sampleListPositions);

        delete[] oldNumSamples;
        delete[] oldSampleListPositions;
    }
    catch (...)
    {
        delete[] oldNumSamples;
        delete[] oldSampleListPositions;

        level ().image ().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}